

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O1

void generate<trng::mt19937>(size_t samples,unsigned_long seed)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  size_t sVar5;
  mt19937 r;
  char local_9f9;
  mt19937 local_9f8;
  
  trng::mt19937::mt19937(&local_9f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# generator ",0xc);
  __s = trng::mt19937::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3510d0);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  seed = ",9);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"type: d\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"count: ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"numbit: ",8);
  trng::int_math::log2_ceil<unsigned_int>(0xffffffff);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  local_9f9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_9f9,1);
  if (samples != 0) {
    sVar5 = 0;
    do {
      if (0x26f < local_9f8.S.mti) {
        lVar4 = 0;
        do {
          uVar1 = local_9f8.S.mt[lVar4 + 1];
          local_9f8.S.mt[lVar4] =
               *(uint *)(&DAT_0010ab34 + (ulong)(uVar1 & 1) * 4) ^ local_9f8.S.mt[lVar4 + 0x18d] ^
               (uVar1 & 0x7ffffffe | local_9f8.S.mt[lVar4] & 0x80000000) >> 1;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0xe3);
        lVar4 = 0;
        do {
          uVar1 = local_9f8.S.mt[lVar4 + 0xe4];
          local_9f8.S.mt[lVar4 + 0xe3] =
               *(uint *)(&DAT_0010ab34 + (ulong)(uVar1 & 1) * 4) ^ local_9f8.S.mt[lVar4] ^
               (uVar1 & 0x7ffffffe | local_9f8.S.mt[lVar4 + 0xe3] & 0x80000000) >> 1;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x18c);
        local_9f8.S.mt[0x26f] =
             *(uint *)(&DAT_0010ab34 + (ulong)(local_9f8.S.mt[0] & 1) * 4) ^ local_9f8.S.mt[0x18c] ^
             (local_9f8.S.mt[0] & 0x7ffffffe | local_9f8.S.mt[0x26f] & 0x80000000) >> 1;
        local_9f8.S.mti = 0;
      }
      local_9f8.S.mti = local_9f8.S.mti + 1;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_9f9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_9f9,1);
      sVar5 = sVar5 + 1;
    } while (sVar5 != samples);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}